

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_driver.cc
# Opt level: O1

void test_94(QPDF *pdf,char *arg2)

{
  char cVar1;
  int iVar2;
  bool bVar3;
  bool bVar4;
  QPDFObjectHandle root_media;
  string root_media_unparse;
  QPDFObjectHandle p5_new_bleed;
  QPDFObjectHandle p1_new_art;
  QPDFObjectHandle p5_new_crop;
  QPDFObjectHandle p5_new_media;
  QPDFObjectHandle p4_crop;
  QPDFObjectHandle p4_orig_crop;
  QPDFObjectHandle p1_new_crop;
  QPDFObjectHandle p4_new_crop;
  QPDFObjectHandle p4_bleed1;
  QPDFObjectHandle p2_new_trim;
  QPDFObjectHandle p2_crop;
  QPDFObjectHandle p1_effective_media;
  QPDFObjectHandle p4_art2;
  QPDFObjectHandle p4_art1;
  QPDFObjectHandle p4_bleed2;
  QPDFObjectHandle p3_crop;
  QPDFObjectHandle p3_media;
  QPDFObjectHandle pages_root;
  vector<QPDFPageObjectHelper,_std::allocator<QPDFPageObjectHelper>_> pages;
  undefined1 local_1c0 [16];
  element_type *local_1b0 [2];
  string local_1a0 [8];
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_198;
  long *local_190;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_188;
  long local_180 [2];
  QPDFObjectHandle local_170;
  long local_160 [2];
  QPDFObjectHandle local_150;
  QPDFObjectHandle local_140;
  QPDFObjectHandle local_130;
  undefined1 local_120 [8];
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_118;
  QPDFObjectHandle local_110;
  QPDFObjectHandle local_100;
  QPDFObjectHandle local_f0;
  QPDFObjectHandle local_e0;
  QPDFObjectHandle local_d0;
  undefined1 local_c0 [8];
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_b8;
  QPDFObjectHandle local_b0;
  QPDFObjectHandle local_a0;
  QPDFObjectHandle local_90;
  undefined1 local_80 [8];
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_78;
  undefined1 local_70 [8];
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_68;
  undefined1 local_60 [8];
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_58;
  string local_50 [8];
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_48;
  long local_40;
  long local_38;
  
  QPDF::getRoot();
  local_190 = local_180;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_190,"/Pages","");
  QPDFObjectHandle::getKey(local_50);
  if (local_190 != local_180) {
    operator_delete(local_190,local_180[0] + 1);
  }
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_1c0._8_8_ !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_1c0._8_8_);
  }
  local_190 = local_180;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_190,"/MediaBox","");
  QPDFObjectHandle::getKey(local_1a0);
  if (local_190 != local_180) {
    operator_delete(local_190,local_180[0] + 1);
  }
  QPDFObjectHandle::unparse_abi_cxx11_();
  QPDFPageDocumentHelper::QPDFPageDocumentHelper((QPDFPageDocumentHelper *)local_1c0,pdf);
  QPDFPageDocumentHelper::getAllPages();
  QPDFPageDocumentHelper::~QPDFPageDocumentHelper((QPDFPageDocumentHelper *)local_1c0);
  if (local_38 - local_40 != 0x118) {
    __assert_fail("pages.size() == 5",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/jberkenbilt[P]qpdf/qpdf/test_driver.cc"
                  ,0xcec,"void test_94(QPDF &, const char *)");
  }
  local_150.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       *(element_type **)(local_40 + 8);
  local_150.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)(local_40 + 0x10);
  if (local_150.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      (local_150.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
       _M_refcount._M_pi)->_M_use_count =
           (local_150.super_BaseHandle.obj.
            super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
           _M_use_count + 1;
      UNLOCK();
    }
    else {
      (local_150.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
       _M_refcount._M_pi)->_M_use_count =
           (local_150.super_BaseHandle.obj.
            super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
           _M_use_count + 1;
    }
  }
  local_1c0._0_8_ = (element_type *)local_1b0;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_1c0,"/MediaBox","");
  QPDFObjectHandle::getKey((string *)&local_170);
  cVar1 = QPDFObjectHandle::isNull();
  if (cVar1 == '\0') {
    __assert_fail("p1.getObjectHandle().getKey(\"/MediaBox\").isNull()",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/jberkenbilt[P]qpdf/qpdf/test_driver.cc"
                  ,0xcf3,"void test_94(QPDF &, const char *)");
  }
  if (local_170.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_170.super_BaseHandle.obj.
               super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi);
  }
  if ((element_type *)local_1c0._0_8_ != (element_type *)local_1b0) {
    operator_delete((void *)local_1c0._0_8_,(ulong)(local_1b0[0] + 1));
  }
  if (local_150.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_150.super_BaseHandle.obj.
               super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi);
  }
  QPDFPageObjectHelper::getMediaBox(SUB81(local_1c0,0));
  cVar1 = QPDFObjectHandle::isSameObjectAs((QPDFObjectHandle *)local_1c0);
  if (cVar1 == '\0') {
    __assert_fail("p1.getMediaBox(false).isSameObjectAs(root_media)",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/jberkenbilt[P]qpdf/qpdf/test_driver.cc"
                  ,0xcf5,"void test_94(QPDF &, const char *)");
  }
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_1c0._8_8_ !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_1c0._8_8_);
  }
  bVar4 = SUB81(local_40,0);
  QPDFPageObjectHelper::getCropBox(SUB81(local_1c0,0),bVar4);
  cVar1 = QPDFObjectHandle::isSameObjectAs((QPDFObjectHandle *)local_1c0);
  if (cVar1 == '\0') {
    __assert_fail("p1.getCropBox(false, false).isSameObjectAs(root_media)",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/jberkenbilt[P]qpdf/qpdf/test_driver.cc"
                  ,0xcf7,"void test_94(QPDF &, const char *)");
  }
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_1c0._8_8_ !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_1c0._8_8_);
  }
  QPDFPageObjectHelper::getBleedBox(SUB81(local_1c0,0),bVar4);
  cVar1 = QPDFObjectHandle::isSameObjectAs((QPDFObjectHandle *)local_1c0);
  if (cVar1 == '\0') {
    __assert_fail("p1.getBleedBox(false, false).isSameObjectAs(root_media)",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/jberkenbilt[P]qpdf/qpdf/test_driver.cc"
                  ,0xcf8,"void test_94(QPDF &, const char *)");
  }
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_1c0._8_8_ !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_1c0._8_8_);
  }
  QPDFPageObjectHelper::getTrimBox(SUB81(local_1c0,0),bVar4);
  cVar1 = QPDFObjectHandle::isSameObjectAs((QPDFObjectHandle *)local_1c0);
  if (cVar1 == '\0') {
    __assert_fail("p1.getTrimBox(false, false).isSameObjectAs(root_media)",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/jberkenbilt[P]qpdf/qpdf/test_driver.cc"
                  ,0xcf9,"void test_94(QPDF &, const char *)");
  }
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_1c0._8_8_ !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_1c0._8_8_);
  }
  QPDFPageObjectHelper::getArtBox(SUB81(local_1c0,0),bVar4);
  cVar1 = QPDFObjectHandle::isSameObjectAs((QPDFObjectHandle *)local_1c0);
  if (cVar1 == '\0') {
    __assert_fail("p1.getArtBox(false, false).isSameObjectAs(root_media)",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/jberkenbilt[P]qpdf/qpdf/test_driver.cc"
                  ,0xcfa,"void test_94(QPDF &, const char *)");
  }
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_1c0._8_8_ !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_1c0._8_8_);
  }
  QPDFPageObjectHelper::getArtBox(SUB81(&local_150,0),bVar4);
  QPDFObjectHandle::unparse_abi_cxx11_();
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_1c0._8_8_ != local_188) {
LAB_0013f037:
    __assert_fail("p1_new_art.unparse() == root_media_unparse",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/jberkenbilt[P]qpdf/qpdf/test_driver.cc"
                  ,0xcfd,"void test_94(QPDF &, const char *)");
  }
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_1c0._8_8_ !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    iVar2 = bcmp((void *)local_1c0._0_8_,local_190,local_1c0._8_8_);
    if (iVar2 != 0) goto LAB_0013f037;
  }
  if ((element_type *)local_1c0._0_8_ != (element_type *)local_1b0) {
    operator_delete((void *)local_1c0._0_8_,(ulong)(local_1b0[0] + 1));
  }
  cVar1 = QPDFObjectHandle::isSameObjectAs(&local_150);
  if (cVar1 != '\0') {
    __assert_fail("!p1_new_art.isSameObjectAs(root_media)",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/jberkenbilt[P]qpdf/qpdf/test_driver.cc"
                  ,0xcfe,"void test_94(QPDF &, const char *)");
  }
  QPDFPageObjectHelper::getCropBox(false,bVar4);
  cVar1 = QPDFObjectHandle::isSameObjectAs(&local_100);
  if (cVar1 != '\0') {
    __assert_fail("!p1_new_crop.isSameObjectAs(root_media)",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/jberkenbilt[P]qpdf/qpdf/test_driver.cc"
                  ,0xd01,"void test_94(QPDF &, const char *)");
  }
  cVar1 = QPDFObjectHandle::isSameObjectAs(&local_100);
  if (cVar1 != '\0') {
    __assert_fail("!p1_new_crop.isSameObjectAs(p1_new_art)",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/jberkenbilt[P]qpdf/qpdf/test_driver.cc"
                  ,0xd02,"void test_94(QPDF &, const char *)");
  }
  QPDFObjectHandle::unparse_abi_cxx11_();
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_1c0._8_8_ != local_188) {
LAB_0013f056:
    __assert_fail("p1_new_crop.unparse() == root_media_unparse",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/jberkenbilt[P]qpdf/qpdf/test_driver.cc"
                  ,0xd03,"void test_94(QPDF &, const char *)");
  }
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_1c0._8_8_ !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    iVar2 = bcmp((void *)local_1c0._0_8_,local_190,local_1c0._8_8_);
    if (iVar2 != 0) goto LAB_0013f056;
  }
  if ((element_type *)local_1c0._0_8_ != (element_type *)local_1b0) {
    operator_delete((void *)local_1c0._0_8_,(ulong)(local_1b0[0] + 1));
  }
  QPDFPageObjectHelper::getMediaBox(SUB81(local_1c0,0));
  cVar1 = QPDFObjectHandle::isSameObjectAs((QPDFObjectHandle *)local_1c0);
  if (cVar1 == '\0') {
    __assert_fail("p1.getMediaBox(false).isSameObjectAs(root_media)",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/jberkenbilt[P]qpdf/qpdf/test_driver.cc"
                  ,0xd05,"void test_94(QPDF &, const char *)");
  }
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_1c0._8_8_ !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_1c0._8_8_);
  }
  QPDFPageObjectHelper::getTrimBox(SUB81(local_1c0,0),bVar4);
  cVar1 = QPDFObjectHandle::isSameObjectAs((QPDFObjectHandle *)local_1c0);
  if (cVar1 == '\0') {
    __assert_fail("p1.getTrimBox(false, false).isSameObjectAs(p1_new_crop)",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/jberkenbilt[P]qpdf/qpdf/test_driver.cc"
                  ,0xd07,"void test_94(QPDF &, const char *)");
  }
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_1c0._8_8_ !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_1c0._8_8_);
  }
  QPDFPageObjectHelper::getMediaBox(SUB81(&local_b0,0));
  QPDFObjectHandle::unparse_abi_cxx11_();
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_1c0._8_8_ != local_188) {
LAB_0013f075:
    __assert_fail("p1_effective_media.unparse() == root_media_unparse",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/jberkenbilt[P]qpdf/qpdf/test_driver.cc"
                  ,0xd0b,"void test_94(QPDF &, const char *)");
  }
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_1c0._8_8_ !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    iVar2 = bcmp((void *)local_1c0._0_8_,local_190,local_1c0._8_8_);
    if (iVar2 != 0) goto LAB_0013f075;
  }
  if ((element_type *)local_1c0._0_8_ != (element_type *)local_1b0) {
    operator_delete((void *)local_1c0._0_8_,(ulong)(local_1b0[0] + 1));
  }
  cVar1 = QPDFObjectHandle::isSameObjectAs(&local_b0);
  if (cVar1 != '\0') {
    __assert_fail("!p1_effective_media.isSameObjectAs(root_media)",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/jberkenbilt[P]qpdf/qpdf/test_driver.cc"
                  ,0xd0c,"void test_94(QPDF &, const char *)");
  }
  QPDFPageObjectHelper::getMediaBox(SUB81(local_1c0,0));
  cVar1 = QPDFObjectHandle::isSameObjectAs((QPDFObjectHandle *)local_1c0);
  if (cVar1 == '\0') {
    __assert_fail("p2.getMediaBox(false).isSameObjectAs(root_media)",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/jberkenbilt[P]qpdf/qpdf/test_driver.cc"
                  ,0xd0f,"void test_94(QPDF &, const char *)");
  }
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_1c0._8_8_ !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_1c0._8_8_);
  }
  QPDFPageObjectHelper::getCropBox(SUB81(local_c0,0),(bool)(bVar4 + '8'));
  QPDFPageObjectHelper::getTrimBox(SUB81(&local_d0,0),(bool)(bVar4 + '8'));
  QPDFObjectHandle::unparse_abi_cxx11_();
  QPDFObjectHandle::unparse_abi_cxx11_();
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_1c0._8_8_ !=
      local_170.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi) {
LAB_0013f094:
    __assert_fail("p2_new_trim.unparse() == p2_crop.unparse()",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/jberkenbilt[P]qpdf/qpdf/test_driver.cc"
                  ,0xd12,"void test_94(QPDF &, const char *)");
  }
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_1c0._8_8_ !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    iVar2 = bcmp((void *)local_1c0._0_8_,
                 local_170.super_BaseHandle.obj.
                 super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr,local_1c0._8_8_);
    if (iVar2 != 0) goto LAB_0013f094;
  }
  if (local_170.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
      _M_ptr != (element_type *)local_160) {
    operator_delete(local_170.super_BaseHandle.obj.
                    super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr,
                    local_160[0] + 1);
  }
  if ((element_type *)local_1c0._0_8_ != (element_type *)local_1b0) {
    operator_delete((void *)local_1c0._0_8_,(ulong)(local_1b0[0] + 1));
  }
  cVar1 = QPDFObjectHandle::isSameObjectAs(&local_d0);
  if (cVar1 != '\0') {
    __assert_fail("!p2_new_trim.isSameObjectAs(p2_crop)",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/jberkenbilt[P]qpdf/qpdf/test_driver.cc"
                  ,0xd13,"void test_94(QPDF &, const char *)");
  }
  QPDFPageObjectHelper::getMediaBox(SUB81(local_1c0,0));
  cVar1 = QPDFObjectHandle::isSameObjectAs((QPDFObjectHandle *)local_1c0);
  if (cVar1 == '\0') {
    __assert_fail("p2.getMediaBox(false).isSameObjectAs(root_media)",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/jberkenbilt[P]qpdf/qpdf/test_driver.cc"
                  ,0xd14,"void test_94(QPDF &, const char *)");
  }
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_1c0._8_8_ !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_1c0._8_8_);
  }
  QPDFPageObjectHelper::getMediaBox(SUB81(local_60,0));
  QPDFPageObjectHelper::getCropBox(SUB81(local_70,0),(bool)(bVar4 + 'p'));
  QPDFPageObjectHelper::getMediaBox(SUB81(local_1c0,0));
  cVar1 = QPDFObjectHandle::isSameObjectAs((QPDFObjectHandle *)local_1c0);
  if (cVar1 == '\0') {
    __assert_fail("p3.getMediaBox(true).isSameObjectAs(p3_media)",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/jberkenbilt[P]qpdf/qpdf/test_driver.cc"
                  ,0xd19,"void test_94(QPDF &, const char *)");
  }
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_1c0._8_8_ !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_1c0._8_8_);
  }
  QPDFPageObjectHelper::getCropBox(SUB81(local_1c0,0),(bool)(bVar4 + 'p'));
  cVar1 = QPDFObjectHandle::isSameObjectAs((QPDFObjectHandle *)local_1c0);
  if (cVar1 == '\0') {
    __assert_fail("p3.getCropBox(true, true).isSameObjectAs(p3_crop)",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/jberkenbilt[P]qpdf/qpdf/test_driver.cc"
                  ,0xd1a,"void test_94(QPDF &, const char *)");
  }
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_1c0._8_8_ !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_1c0._8_8_);
  }
  local_170.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       *(element_type **)(local_40 + 0xb0);
  local_170.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)(local_40 + 0xb8);
  if (local_170.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      (local_170.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
       _M_refcount._M_pi)->_M_use_count =
           (local_170.super_BaseHandle.obj.
            super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
           _M_use_count + 1;
      UNLOCK();
    }
    else {
      (local_170.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
       _M_refcount._M_pi)->_M_use_count =
           (local_170.super_BaseHandle.obj.
            super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
           _M_use_count + 1;
    }
  }
  local_1c0._0_8_ = (element_type *)local_1b0;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_1c0,"/CropBox","");
  QPDFObjectHandle::getKey((string *)&local_110);
  if ((element_type *)local_1c0._0_8_ != (element_type *)local_1b0) {
    operator_delete((void *)local_1c0._0_8_,(ulong)(local_1b0[0] + 1));
  }
  bVar3 = (bool)(bVar4 + -0x58);
  if (local_170.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_170.super_BaseHandle.obj.
               super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi);
  }
  QPDFPageObjectHelper::getCropBox(SUB81(local_120,0),bVar3);
  cVar1 = QPDFObjectHandle::isSameObjectAs(&local_110);
  if (cVar1 == '\0') {
    __assert_fail("p4_orig_crop.isSameObjectAs(p4_crop)",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/jberkenbilt[P]qpdf/qpdf/test_driver.cc"
                  ,0xd1f,"void test_94(QPDF &, const char *)");
  }
  QPDFPageObjectHelper::getBleedBox(SUB81(&local_e0,0),bVar3);
  QPDFPageObjectHelper::getBleedBox(SUB81(local_80,0),bVar3);
  cVar1 = QPDFObjectHandle::isSameObjectAs(&local_e0);
  if (cVar1 != '\0') {
    __assert_fail("!p4_bleed1.isSameObjectAs(p4_crop)",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/jberkenbilt[P]qpdf/qpdf/test_driver.cc"
                  ,0xd22,"void test_94(QPDF &, const char *)");
  }
  cVar1 = QPDFObjectHandle::isSameObjectAs(&local_e0);
  if (cVar1 == '\0') {
    __assert_fail("p4_bleed1.isSameObjectAs(p4_bleed2)",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/jberkenbilt[P]qpdf/qpdf/test_driver.cc"
                  ,0xd23,"void test_94(QPDF &, const char *)");
  }
  QPDFPageObjectHelper::getArtBox(SUB81(&local_90,0),bVar3);
  cVar1 = QPDFObjectHandle::isSameObjectAs(&local_90);
  if (cVar1 == '\0') {
    __assert_fail("p4_art1.isSameObjectAs(p4_crop)",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/jberkenbilt[P]qpdf/qpdf/test_driver.cc"
                  ,0xd25,"void test_94(QPDF &, const char *)");
  }
  QPDFPageObjectHelper::getArtBox(SUB81(&local_a0,0),bVar3);
  cVar1 = QPDFObjectHandle::isSameObjectAs(&local_a0);
  if (cVar1 != '\0') {
    __assert_fail("!p4_art2.isSameObjectAs(p4_crop)",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/jberkenbilt[P]qpdf/qpdf/test_driver.cc"
                  ,0xd27,"void test_94(QPDF &, const char *)");
  }
  QPDFPageObjectHelper::getCropBox(SUB81(&local_f0,0),bVar3);
  cVar1 = QPDFObjectHandle::isSameObjectAs(&local_f0);
  if (cVar1 != '\0') {
    __assert_fail("!p4_new_crop.isSameObjectAs(p4_orig_crop)",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/jberkenbilt[P]qpdf/qpdf/test_driver.cc"
                  ,0xd29,"void test_94(QPDF &, const char *)");
  }
  cVar1 = QPDFObjectHandle::isIndirect();
  if (cVar1 == '\0') {
    __assert_fail("p4_orig_crop.isIndirect()",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/jberkenbilt[P]qpdf/qpdf/test_driver.cc"
                  ,0xd2a,"void test_94(QPDF &, const char *)");
  }
  cVar1 = QPDFObjectHandle::isIndirect();
  if (cVar1 != '\0') {
    __assert_fail("!p4_new_crop.isIndirect()",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/jberkenbilt[P]qpdf/qpdf/test_driver.cc"
                  ,0xd2b,"void test_94(QPDF &, const char *)");
  }
  QPDFObjectHandle::unparse_abi_cxx11_();
  QPDFObjectHandle::unparseResolved_abi_cxx11_();
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_1c0._8_8_ !=
      local_170.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi) {
LAB_0013f0b3:
    __assert_fail("p4_new_crop.unparse() == p4_orig_crop.unparseResolved()",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/jberkenbilt[P]qpdf/qpdf/test_driver.cc"
                  ,0xd2c,"void test_94(QPDF &, const char *)");
  }
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_1c0._8_8_ !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    iVar2 = bcmp((void *)local_1c0._0_8_,
                 local_170.super_BaseHandle.obj.
                 super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr,local_1c0._8_8_);
    if (iVar2 != 0) goto LAB_0013f0b3;
  }
  if (local_170.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
      _M_ptr != (element_type *)local_160) {
    operator_delete(local_170.super_BaseHandle.obj.
                    super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr,
                    local_160[0] + 1);
  }
  bVar4 = (bool)(bVar4 + -0x20);
  if ((element_type *)local_1c0._0_8_ != (element_type *)local_1b0) {
    operator_delete((void *)local_1c0._0_8_,(ulong)(local_1b0[0] + 1));
  }
  QPDFPageObjectHelper::getMediaBox(SUB81(local_1c0,0));
  cVar1 = QPDFObjectHandle::isSameObjectAs((QPDFObjectHandle *)local_1c0);
  if (cVar1 == '\0') {
    __assert_fail("p5.getMediaBox(false).isSameObjectAs(root_media)",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/jberkenbilt[P]qpdf/qpdf/test_driver.cc"
                  ,0xd2f,"void test_94(QPDF &, const char *)");
  }
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_1c0._8_8_ !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_1c0._8_8_);
  }
  QPDFPageObjectHelper::getCropBox(SUB81(local_1c0,0),bVar4);
  cVar1 = QPDFObjectHandle::isSameObjectAs((QPDFObjectHandle *)local_1c0);
  if (cVar1 == '\0') {
    __assert_fail("p5.getCropBox(false, false).isSameObjectAs(root_media)",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/jberkenbilt[P]qpdf/qpdf/test_driver.cc"
                  ,0xd30,"void test_94(QPDF &, const char *)");
  }
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_1c0._8_8_ !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_1c0._8_8_);
  }
  QPDFPageObjectHelper::getBleedBox(SUB81(local_1c0,0),bVar4);
  cVar1 = QPDFObjectHandle::isSameObjectAs((QPDFObjectHandle *)local_1c0);
  if (cVar1 == '\0') {
    __assert_fail("p5.getBleedBox(false, false).isSameObjectAs(root_media)",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/jberkenbilt[P]qpdf/qpdf/test_driver.cc"
                  ,0xd31,"void test_94(QPDF &, const char *)");
  }
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_1c0._8_8_ !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_1c0._8_8_);
  }
  QPDFPageObjectHelper::getBleedBox(SUB81(&local_170,0),bVar4);
  QPDFPageObjectHelper::getMediaBox(SUB81(&local_130,0));
  QPDFPageObjectHelper::getCropBox(SUB81(&local_140,0),bVar4);
  cVar1 = QPDFObjectHandle::isSameObjectAs(&local_130);
  if (cVar1 != '\0') {
    __assert_fail("!p5_new_media.isSameObjectAs(root_media)",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/jberkenbilt[P]qpdf/qpdf/test_driver.cc"
                  ,0xd35,"void test_94(QPDF &, const char *)");
  }
  cVar1 = QPDFObjectHandle::isSameObjectAs(&local_140);
  if (cVar1 != '\0') {
    __assert_fail("!p5_new_crop.isSameObjectAs(root_media)",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/jberkenbilt[P]qpdf/qpdf/test_driver.cc"
                  ,0xd36,"void test_94(QPDF &, const char *)");
  }
  cVar1 = QPDFObjectHandle::isSameObjectAs(&local_140);
  if (cVar1 != '\0') {
    __assert_fail("!p5_new_crop.isSameObjectAs(p5_new_media)",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/jberkenbilt[P]qpdf/qpdf/test_driver.cc"
                  ,0xd37,"void test_94(QPDF &, const char *)");
  }
  cVar1 = QPDFObjectHandle::isSameObjectAs(&local_170);
  if (cVar1 != '\0') {
    __assert_fail("!p5_new_bleed.isSameObjectAs(root_media)",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/jberkenbilt[P]qpdf/qpdf/test_driver.cc"
                  ,0xd38,"void test_94(QPDF &, const char *)");
  }
  cVar1 = QPDFObjectHandle::isSameObjectAs(&local_170);
  if (cVar1 != '\0') {
    __assert_fail("!p5_new_bleed.isSameObjectAs(p5_new_media)",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/jberkenbilt[P]qpdf/qpdf/test_driver.cc"
                  ,0xd39,"void test_94(QPDF &, const char *)");
  }
  cVar1 = QPDFObjectHandle::isSameObjectAs(&local_170);
  if (cVar1 != '\0') {
    __assert_fail("!p5_new_bleed.isSameObjectAs(p5_new_crop)",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/jberkenbilt[P]qpdf/qpdf/test_driver.cc"
                  ,0xd3a,"void test_94(QPDF &, const char *)");
  }
  QPDFObjectHandle::unparse_abi_cxx11_();
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_1c0._8_8_ != local_188) {
LAB_0013f0d2:
    __assert_fail("p5_new_media.unparse() == root_media_unparse",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/jberkenbilt[P]qpdf/qpdf/test_driver.cc"
                  ,0xd3b,"void test_94(QPDF &, const char *)");
  }
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_1c0._8_8_ !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    iVar2 = bcmp((void *)local_1c0._0_8_,local_190,local_1c0._8_8_);
    if (iVar2 != 0) goto LAB_0013f0d2;
  }
  if ((element_type *)local_1c0._0_8_ != (element_type *)local_1b0) {
    operator_delete((void *)local_1c0._0_8_,(ulong)(local_1b0[0] + 1));
  }
  QPDFObjectHandle::unparse_abi_cxx11_();
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_1c0._8_8_ != local_188) {
LAB_0013f0f1:
    __assert_fail("p5_new_crop.unparse() == root_media_unparse",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/jberkenbilt[P]qpdf/qpdf/test_driver.cc"
                  ,0xd3c,"void test_94(QPDF &, const char *)");
  }
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_1c0._8_8_ !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    iVar2 = bcmp((void *)local_1c0._0_8_,local_190,local_1c0._8_8_);
    if (iVar2 != 0) goto LAB_0013f0f1;
  }
  if ((element_type *)local_1c0._0_8_ != (element_type *)local_1b0) {
    operator_delete((void *)local_1c0._0_8_,(ulong)(local_1b0[0] + 1));
  }
  QPDFObjectHandle::unparse_abi_cxx11_();
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_1c0._8_8_ == local_188) {
    if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_1c0._8_8_ !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      iVar2 = bcmp((void *)local_1c0._0_8_,local_190,local_1c0._8_8_);
      if (iVar2 != 0) goto LAB_0013f110;
    }
    if ((element_type *)local_1c0._0_8_ != (element_type *)local_1b0) {
      operator_delete((void *)local_1c0._0_8_,(ulong)(local_1b0[0] + 1));
    }
    if (local_140.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
        _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_140.super_BaseHandle.obj.
                 super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi);
    }
    if (local_130.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
        _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_130.super_BaseHandle.obj.
                 super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi);
    }
    if (local_170.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
        _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_170.super_BaseHandle.obj.
                 super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi);
    }
    if (local_f0.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
        _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_f0.super_BaseHandle.obj.
                 super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi);
    }
    if (local_a0.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
        _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_a0.super_BaseHandle.obj.
                 super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi);
    }
    if (local_90.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
        _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_90.super_BaseHandle.obj.
                 super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi);
    }
    if (local_78 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_78);
    }
    if (local_e0.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
        _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_e0.super_BaseHandle.obj.
                 super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi);
    }
    if (local_118 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_118);
    }
    if (local_110.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
        _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_110.super_BaseHandle.obj.
                 super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi);
    }
    if (local_68 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_68);
    }
    if (local_58 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_58);
    }
    if (local_d0.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
        _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_d0.super_BaseHandle.obj.
                 super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi);
    }
    if (local_b8 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_b8);
    }
    if (local_b0.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
        _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_b0.super_BaseHandle.obj.
                 super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi);
    }
    if (local_100.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
        _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_100.super_BaseHandle.obj.
                 super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi);
    }
    if (local_150.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
        _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_150.super_BaseHandle.obj.
                 super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi);
    }
    std::vector<QPDFPageObjectHelper,_std::allocator<QPDFPageObjectHelper>_>::~vector
              ((vector<QPDFPageObjectHelper,_std::allocator<QPDFPageObjectHelper>_> *)&local_40);
    if (local_190 != local_180) {
      operator_delete(local_190,local_180[0] + 1);
    }
    if (local_198 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_198);
    }
    if (local_48 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_48);
    }
    return;
  }
LAB_0013f110:
  __assert_fail("p5_new_bleed.unparse() == root_media_unparse",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/jberkenbilt[P]qpdf/qpdf/test_driver.cc"
                ,0xd3d,"void test_94(QPDF &, const char *)");
}

Assistant:

static void
test_94(QPDF& pdf, char const* arg2)
{
    // Exercise methods to get page boxes. This test is built for
    // boxes2.pdf.

    // /MediaBox is present in the pages tree root.
    // Each page has the following boxes present directly:
    // 1. none
    // 2. crop
    // 3. media, crop
    // 4. media, crop, trim, bleed; crop is indirect
    // 5. trim, art

    auto pages_root = pdf.getRoot().getKey("/Pages");
    auto root_media = pages_root.getKey("/MediaBox");
    auto root_media_unparse = root_media.unparse();
    auto pages = QPDFPageDocumentHelper(pdf).getAllPages();
    assert(pages.size() == 5);
    auto& p1 = pages[0];
    auto& p2 = pages[1];
    auto& p3 = pages[2];
    auto& p4 = pages[3];
    auto& p5 = pages[4];

    assert(p1.getObjectHandle().getKey("/MediaBox").isNull());
    // MediaBox not present, so get inherited one
    assert(p1.getMediaBox(false).isSameObjectAs(root_media));
    // Other boxesBox not present, so fall back to MediaBox
    assert(p1.getCropBox(false, false).isSameObjectAs(root_media));
    assert(p1.getBleedBox(false, false).isSameObjectAs(root_media));
    assert(p1.getTrimBox(false, false).isSameObjectAs(root_media));
    assert(p1.getArtBox(false, false).isSameObjectAs(root_media));
    // Make copy of artbox
    auto p1_new_art = p1.getArtBox(false, true);
    assert(p1_new_art.unparse() == root_media_unparse);
    assert(!p1_new_art.isSameObjectAs(root_media));
    // This also copied cropbox
    auto p1_new_crop = p1.getCropBox(false, false);
    assert(!p1_new_crop.isSameObjectAs(root_media));
    assert(!p1_new_crop.isSameObjectAs(p1_new_art));
    assert(p1_new_crop.unparse() == root_media_unparse);
    // But it didn't copy Media
    assert(p1.getMediaBox(false).isSameObjectAs(root_media));
    // Now fall back to new crop
    assert(p1.getTrimBox(false, false).isSameObjectAs(p1_new_crop));
    // Request copy. The value returned has the same structure but is
    // a different object.
    auto p1_effective_media = p1.getMediaBox(true);
    assert(p1_effective_media.unparse() == root_media_unparse);
    assert(!p1_effective_media.isSameObjectAs(root_media));

    // copy_on_fallback didn't have to copy media to crop
    assert(p2.getMediaBox(false).isSameObjectAs(root_media));
    auto p2_crop = p2.getCropBox(false, false);
    auto p2_new_trim = p2.getTrimBox(false, true);
    assert(p2_new_trim.unparse() == p2_crop.unparse());
    assert(!p2_new_trim.isSameObjectAs(p2_crop));
    assert(p2.getMediaBox(false).isSameObjectAs(root_media));

    // We didn't need to copy anything
    auto p3_media = p3.getMediaBox(false);
    auto p3_crop = p3.getCropBox(false, false);
    assert(p3.getMediaBox(true).isSameObjectAs(p3_media));
    assert(p3.getCropBox(true, true).isSameObjectAs(p3_crop));

    // We didn't have to copy for bleed but we did for art
    auto p4_orig_crop = p4.getObjectHandle().getKey("/CropBox");
    auto p4_crop = p4.getCropBox(false, false);
    assert(p4_orig_crop.isSameObjectAs(p4_crop));
    auto p4_bleed1 = p4.getBleedBox(false, false);
    auto p4_bleed2 = p4.getBleedBox(false, true);
    assert(!p4_bleed1.isSameObjectAs(p4_crop));
    assert(p4_bleed1.isSameObjectAs(p4_bleed2));
    auto p4_art1 = p4.getArtBox(false, false);
    assert(p4_art1.isSameObjectAs(p4_crop));
    auto p4_art2 = p4.getArtBox(false, true);
    assert(!p4_art2.isSameObjectAs(p4_crop));
    auto p4_new_crop = p4.getCropBox(true, false);
    assert(!p4_new_crop.isSameObjectAs(p4_orig_crop));
    assert(p4_orig_crop.isIndirect());
    assert(!p4_new_crop.isIndirect());
    assert(p4_new_crop.unparse() == p4_orig_crop.unparseResolved());

    // Exercise copying for inheritance and fallback
    assert(p5.getMediaBox(false).isSameObjectAs(root_media));
    assert(p5.getCropBox(false, false).isSameObjectAs(root_media));
    assert(p5.getBleedBox(false, false).isSameObjectAs(root_media));
    auto p5_new_bleed = p5.getBleedBox(true, true);
    auto p5_new_media = p5.getMediaBox(false);
    auto p5_new_crop = p5.getCropBox(false, false);
    assert(!p5_new_media.isSameObjectAs(root_media));
    assert(!p5_new_crop.isSameObjectAs(root_media));
    assert(!p5_new_crop.isSameObjectAs(p5_new_media));
    assert(!p5_new_bleed.isSameObjectAs(root_media));
    assert(!p5_new_bleed.isSameObjectAs(p5_new_media));
    assert(!p5_new_bleed.isSameObjectAs(p5_new_crop));
    assert(p5_new_media.unparse() == root_media_unparse);
    assert(p5_new_crop.unparse() == root_media_unparse);
    assert(p5_new_bleed.unparse() == root_media_unparse);
}